

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceIntersector1>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 (*pauVar8) [16];
  byte bVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  undefined7 extraout_var;
  long lVar13;
  undefined1 (*pauVar14) [16];
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  InstancePrimitive *prim;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar37 [16];
  float fVar41;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined4 local_ffc;
  float local_fd8 [4];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  ulong local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  uVar12 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar12 == 8) {
    local_ffc._0_1_ = false;
  }
  else {
    local_f78 = uVar12;
    uStack_f70 = 0;
    fVar54 = (query->p).field_0.field_0.x;
    fVar1 = (query->p).field_0.field_0.y;
    fVar2 = (query->p).field_0.field_0.z;
    local_fa8 = (context->query_radius).field_0.m128[0];
    fStack_fb4 = *(float *)((long)&(context->query_radius).field_0 + 4);
    fStack_fc4 = *(float *)((long)&(context->query_radius).field_0 + 8);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar49 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar3 = (context->query_radius).field_0;
      auVar49 = dpps((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    }
    pauVar14 = (undefined1 (*) [16])local_f68;
    auVar53._4_4_ = fVar1;
    auVar53._0_4_ = fVar1;
    auVar53._8_4_ = fVar1;
    auVar53._12_4_ = fVar1;
    auVar52._4_4_ = fVar2;
    auVar52._0_4_ = fVar2;
    auVar52._8_4_ = fVar2;
    auVar52._12_4_ = fVar2;
    local_fb8 = fStack_fb4;
    fStack_fb0 = fStack_fb4;
    fStack_fac = fStack_fb4;
    local_fc8 = fStack_fc4;
    fStack_fc0 = fStack_fc4;
    fStack_fbc = fStack_fc4;
    fVar25 = local_fa8 * local_fa8;
    local_ffc = 0;
    local_f88 = fVar54;
    fStack_f84 = fVar54;
    fStack_f80 = fVar54;
    fStack_f7c = fVar54;
    fVar26 = fVar25;
    fVar27 = fVar25;
    fVar28 = fVar25;
    fStack_fa4 = local_fa8;
    fStack_fa0 = local_fa8;
    fStack_f9c = local_fa8;
    fVar55 = fVar54;
    fVar56 = fVar54;
    fVar57 = fVar54;
    do {
      local_f98._4_4_ = fVar55 - fStack_fa4;
      local_f98._0_4_ = fVar54 - local_fa8;
      fStack_f90 = fVar56 - fStack_fa0;
      fStack_f8c = fVar57 - fStack_f9c;
      while (pauVar8 = pauVar14 + -1, pauVar14 = pauVar14 + -1, _local_f98 = auVar49,
            *(float *)((long)*pauVar8 + 8) <= auVar49._0_4_) {
        uVar16 = *(ulong *)*pauVar14;
LAB_00da8023:
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar16 & 8) != 0) goto LAB_00da839a;
          auVar29 = *(undefined1 (*) [16])(uVar16 + 0x20);
          auVar32 = *(undefined1 (*) [16])(uVar16 + 0x30);
          auVar31._4_4_ = fVar55;
          auVar31._0_4_ = fVar54;
          auVar31._8_4_ = fVar56;
          auVar31._12_4_ = fVar57;
          auVar31 = maxps(auVar31,auVar29);
          auVar31 = minps(auVar31,auVar32);
          fVar30 = auVar31._0_4_ - fVar54;
          fVar33 = auVar31._4_4_ - fVar55;
          fVar34 = auVar31._8_4_ - fVar56;
          fVar35 = auVar31._12_4_ - fVar57;
          auVar31 = maxps(auVar53,*(undefined1 (*) [16])(uVar16 + 0x40));
          auVar31 = minps(auVar31,*(undefined1 (*) [16])(uVar16 + 0x50));
          fVar36 = auVar31._0_4_ - fVar1;
          fVar38 = auVar31._4_4_ - fVar1;
          fVar39 = auVar31._8_4_ - fVar1;
          fVar40 = auVar31._12_4_ - fVar1;
          auVar31 = maxps(auVar52,*(undefined1 (*) [16])(uVar16 + 0x60));
          auVar31 = minps(auVar31,*(undefined1 (*) [16])(uVar16 + 0x70));
          fVar41 = auVar31._0_4_ - fVar2;
          fVar46 = auVar31._4_4_ - fVar2;
          fVar47 = auVar31._8_4_ - fVar2;
          fVar48 = auVar31._12_4_ - fVar2;
          local_fd8[0] = fVar41 * fVar41 + fVar36 * fVar36 + fVar30 * fVar30;
          local_fd8[1] = fVar46 * fVar46 + fVar38 * fVar38 + fVar33 * fVar33;
          local_fd8[2] = fVar47 * fVar47 + fVar39 * fVar39 + fVar34 * fVar34;
          local_fd8[3] = fVar48 * fVar48 + fVar40 * fVar40 + fVar35 * fVar35;
          bVar6 = auVar29._0_4_ <= auVar32._0_4_ && local_fd8[0] <= fVar25;
          bVar7 = auVar29._4_4_ <= auVar32._4_4_ && local_fd8[1] <= fVar26;
          bVar5 = auVar29._8_4_ <= auVar32._8_4_ && local_fd8[2] <= fVar27;
          bVar10 = auVar29._12_4_ <= auVar32._12_4_ && local_fd8[3] <= fVar28;
        }
        else {
          if ((uVar16 & 8) != 0) {
LAB_00da839a:
            lVar13 = (ulong)((uint)uVar16 & 0xf) - 8;
            if (lVar13 != 0) {
              prim = (InstancePrimitive *)(uVar16 & 0xfffffffffffffff0);
              bVar9 = 0;
              do {
                bVar15 = bVar9;
                bVar10 = InstanceIntersector1::pointQuery(query,context,prim);
                uVar12 = CONCAT71(extraout_var,bVar10);
                prim = prim + 1;
                lVar13 = lVar13 + -1;
                bVar9 = bVar15 | bVar10;
              } while (lVar13 != 0);
              fVar54 = local_f88;
              fVar55 = fStack_f84;
              fVar56 = fStack_f80;
              fVar57 = fStack_f7c;
              if (bVar15 != 0 || bVar10) {
                auVar49 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
                local_fa8 = auVar49._0_4_;
                fStack_fb4 = auVar49._4_4_;
                fStack_fc4 = auVar49._8_4_;
                local_fb8 = fStack_fb4;
                fStack_fb0 = fStack_fb4;
                fStack_fac = fStack_fb4;
                local_fc8 = fStack_fc4;
                fStack_fc0 = fStack_fc4;
                fStack_fbc = fStack_fc4;
                if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                  _local_f98 = ZEXT416((uint)(query->radius * query->radius));
                }
                else {
                  _local_f98 = dpps(auVar49,auVar49,0x7f);
                }
                uVar12 = CONCAT71(extraout_var,1);
                local_ffc = (undefined4)uVar12;
                fStack_fa4 = local_fa8;
                fStack_fa0 = local_fa8;
                fStack_f9c = local_fa8;
              }
            }
            break;
          }
          auVar29 = *(undefined1 (*) [16])(uVar16 + 0x60);
          auVar32 = *(undefined1 (*) [16])(uVar16 + 0x20);
          auVar31 = *(undefined1 (*) [16])(uVar16 + 0x30);
          auVar44 = *(undefined1 (*) [16])(uVar16 + 0x40);
          auVar45 = *(undefined1 (*) [16])(uVar16 + 0x50);
          auVar51 = *(undefined1 (*) [16])(uVar16 + 0x70);
          auVar43._4_4_ = fVar55;
          auVar43._0_4_ = fVar54;
          auVar43._8_4_ = fVar56;
          auVar43._12_4_ = fVar57;
          auVar43 = maxps(auVar43,auVar32);
          auVar43 = minps(auVar43,auVar31);
          fVar30 = auVar43._0_4_ - fVar54;
          fVar34 = auVar43._4_4_ - fVar55;
          fVar36 = auVar43._8_4_ - fVar56;
          fVar39 = auVar43._12_4_ - fVar57;
          auVar43 = maxps(auVar53,auVar44);
          auVar43 = minps(auVar43,auVar45);
          fVar41 = auVar43._0_4_ - fVar1;
          fVar46 = auVar43._4_4_ - fVar1;
          fVar47 = auVar43._8_4_ - fVar1;
          fVar48 = auVar43._12_4_ - fVar1;
          auVar43 = maxps(auVar52,auVar29);
          auVar43 = minps(auVar43,auVar51);
          fVar33 = auVar43._0_4_ - fVar2;
          fVar35 = auVar43._4_4_ - fVar2;
          fVar38 = auVar43._8_4_ - fVar2;
          fVar40 = auVar43._12_4_ - fVar2;
          local_fd8[0] = fVar33 * fVar33 + fVar41 * fVar41 + fVar30 * fVar30;
          local_fd8[1] = fVar35 * fVar35 + fVar46 * fVar46 + fVar34 * fVar34;
          local_fd8[2] = fVar38 * fVar38 + fVar47 * fVar47 + fVar36 * fVar36;
          local_fd8[3] = fVar40 * fVar40 + fVar48 * fVar48 + fVar39 * fVar39;
          bVar6 = ((auVar29._0_4_ <= fVar2 + local_fc8 && fVar54 - local_fa8 <= auVar31._0_4_) &&
                  (auVar32._0_4_ <= fVar54 + local_fa8 && auVar44._0_4_ <= fVar1 + local_fb8)) &&
                  (fVar2 - local_fc8 <= auVar51._0_4_ &&
                  (auVar32._0_4_ <= auVar31._0_4_ && fVar1 - local_fb8 <= auVar45._0_4_));
          bVar7 = ((auVar29._4_4_ <= fVar2 + fStack_fc4 && fVar55 - fStack_fa4 <= auVar31._4_4_) &&
                  (auVar32._4_4_ <= fVar55 + fStack_fa4 && auVar44._4_4_ <= fVar1 + fStack_fb4)) &&
                  (fVar2 - fStack_fc4 <= auVar51._4_4_ &&
                  (auVar32._4_4_ <= auVar31._4_4_ && fVar1 - fStack_fb4 <= auVar45._4_4_));
          bVar5 = ((auVar29._8_4_ <= fVar2 + fStack_fc0 && fVar56 - fStack_fa0 <= auVar31._8_4_) &&
                  (auVar32._8_4_ <= fVar56 + fStack_fa0 && auVar44._8_4_ <= fVar1 + fStack_fb0)) &&
                  (fVar2 - fStack_fc0 <= auVar51._8_4_ &&
                  (auVar32._8_4_ <= auVar31._8_4_ && fVar1 - fStack_fb0 <= auVar45._8_4_));
          bVar10 = ((auVar29._12_4_ <= fVar2 + fStack_fbc && fVar57 - fStack_f9c <= auVar31._12_4_)
                   && (auVar32._12_4_ <= fVar57 + fStack_f9c && auVar44._12_4_ <= fVar1 + fStack_fac
                      )) && (fVar2 - fStack_fbc <= auVar51._12_4_ &&
                            (auVar32._12_4_ <= auVar31._12_4_ &&
                            fVar1 - fStack_fac <= auVar45._12_4_));
        }
        auVar29._0_4_ = (uint)bVar6 * -0x80000000;
        auVar29._4_4_ = (uint)bVar7 * -0x80000000;
        auVar29._8_4_ = (uint)bVar5 * -0x80000000;
        auVar29._12_4_ = (uint)bVar10 * -0x80000000;
        uVar11 = movmskps((int)uVar12,auVar29);
        uVar12 = (ulong)uVar11;
        if (uVar11 != 0) {
          uVar17 = uVar16 & 0xfffffffffffffff0;
          lVar13 = 0;
          if ((byte)uVar11 != 0) {
            for (; ((byte)uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar12 = *(ulong *)(uVar17 + lVar13 * 8);
          uVar11 = (uVar11 & 0xff) - 1 & uVar11 & 0xff;
          uVar16 = uVar12;
          if (uVar11 != 0) {
            fVar30 = local_fd8[lVar13];
            lVar13 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            uVar16 = *(ulong *)(uVar17 + lVar13 * 8);
            fVar33 = local_fd8[lVar13];
            uVar11 = uVar11 - 1 & uVar11;
            if (uVar11 == 0) {
              if ((uint)fVar30 < (uint)fVar33) {
                *(ulong *)*pauVar14 = uVar16;
                *(float *)((long)*pauVar14 + 8) = fVar33;
                pauVar14 = pauVar14 + 1;
                uVar16 = uVar12;
              }
              else {
                *(ulong *)*pauVar14 = uVar12;
                *(float *)((long)*pauVar14 + 8) = fVar30;
                uVar12 = uVar16;
                pauVar14 = pauVar14 + 1;
              }
            }
            else {
              auVar32._8_4_ = fVar30;
              auVar32._0_8_ = uVar12;
              auVar32._12_4_ = 0;
              auVar44._8_4_ = fVar33;
              auVar44._0_8_ = uVar16;
              auVar44._12_4_ = 0;
              lVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              uVar4 = *(undefined8 *)(uVar17 + lVar13 * 8);
              fVar34 = local_fd8[lVar13];
              auVar51._8_4_ = fVar34;
              auVar51._0_8_ = uVar4;
              auVar51._12_4_ = 0;
              auVar45._8_4_ = -(uint)((int)fVar30 < (int)fVar33);
              uVar11 = uVar11 - 1 & uVar11;
              if (uVar11 == 0) {
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar42._8_4_ = fVar33;
                auVar42._0_8_ = uVar16;
                auVar42._12_4_ = 0;
                auVar43 = blendvps(auVar42,auVar32,auVar45);
                auVar29 = blendvps(auVar32,auVar44,auVar45);
                auVar18._8_4_ = -(uint)(auVar43._8_4_ < (int)fVar34);
                auVar18._4_4_ = auVar18._8_4_;
                auVar18._0_4_ = auVar18._8_4_;
                auVar18._12_4_ = auVar18._8_4_;
                auVar37._8_4_ = fVar34;
                auVar37._0_8_ = uVar4;
                auVar37._12_4_ = 0;
                auVar31 = blendvps(auVar37,auVar43,auVar18);
                auVar44 = blendvps(auVar43,auVar51,auVar18);
                auVar19._8_4_ = -(uint)(auVar29._8_4_ < auVar44._8_4_);
                auVar19._4_4_ = auVar19._8_4_;
                auVar19._0_4_ = auVar19._8_4_;
                auVar19._12_4_ = auVar19._8_4_;
                auVar32 = blendvps(auVar44,auVar29,auVar19);
                auVar29 = blendvps(auVar29,auVar44,auVar19);
                *pauVar14 = auVar29;
                pauVar14[1] = auVar32;
                uVar12 = auVar31._0_8_;
                pauVar14 = pauVar14 + 2;
                uVar16 = uVar12;
              }
              else {
                lVar13 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                auVar20._4_4_ = auVar45._8_4_;
                auVar20._0_4_ = auVar45._8_4_;
                auVar20._8_4_ = auVar45._8_4_;
                auVar20._12_4_ = auVar45._8_4_;
                auVar45 = blendvps(auVar44,auVar32,auVar20);
                auVar29 = blendvps(auVar32,auVar44,auVar20);
                auVar50._8_4_ = local_fd8[lVar13];
                auVar50._0_8_ = *(undefined8 *)(uVar17 + lVar13 * 8);
                auVar50._12_4_ = 0;
                auVar21._8_4_ = -(uint)((int)fVar34 < (int)local_fd8[lVar13]);
                auVar21._4_4_ = auVar21._8_4_;
                auVar21._0_4_ = auVar21._8_4_;
                auVar21._12_4_ = auVar21._8_4_;
                auVar31 = blendvps(auVar50,auVar51,auVar21);
                auVar32 = blendvps(auVar51,auVar50,auVar21);
                auVar22._8_4_ = -(uint)(auVar29._8_4_ < auVar32._8_4_);
                auVar22._4_4_ = auVar22._8_4_;
                auVar22._0_4_ = auVar22._8_4_;
                auVar22._12_4_ = auVar22._8_4_;
                auVar51 = blendvps(auVar32,auVar29,auVar22);
                auVar29 = blendvps(auVar29,auVar32,auVar22);
                auVar23._8_4_ = -(uint)(auVar45._8_4_ < auVar31._8_4_);
                auVar23._4_4_ = auVar23._8_4_;
                auVar23._0_4_ = auVar23._8_4_;
                auVar23._12_4_ = auVar23._8_4_;
                auVar32 = blendvps(auVar31,auVar45,auVar23);
                auVar44 = blendvps(auVar45,auVar31,auVar23);
                auVar24._8_4_ = -(uint)(auVar44._8_4_ < auVar51._8_4_);
                auVar24._4_4_ = auVar24._8_4_;
                auVar24._0_4_ = auVar24._8_4_;
                auVar24._12_4_ = auVar24._8_4_;
                auVar31 = blendvps(auVar51,auVar44,auVar24);
                auVar44 = blendvps(auVar44,auVar51,auVar24);
                *pauVar14 = auVar29;
                pauVar14[1] = auVar44;
                pauVar14[2] = auVar31;
                uVar12 = auVar32._0_8_;
                pauVar14 = pauVar14 + 3;
                uVar16 = uVar12;
              }
            }
          }
          goto LAB_00da8023;
        }
        if (pauVar14 == (undefined1 (*) [16])&local_f78) {
          return local_ffc._0_1_;
        }
      }
      fVar25 = local_fa8 * local_fa8;
      fVar26 = fStack_fa4 * fStack_fa4;
      fVar27 = fStack_fa0 * fStack_fa0;
      fVar28 = fStack_f9c * fStack_f9c;
      auVar49 = _local_f98;
    } while (pauVar14 != (undefined1 (*) [16])&local_f78);
  }
  return local_ffc._0_1_;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }